

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

bool wallet::coinselector_tests::EquivalentResult(SelectionResult *a,SelectionResult *b)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  iterator iVar5;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  iterator iVar9;
  _Rb_tree_header *p_Var10;
  long in_FS_OFFSET;
  vector<long,_std::allocator<long>_> b_amts;
  vector<long,_std::allocator<long>_> a_amts;
  long *local_68;
  long *plStack_60;
  long *local_58;
  long *local_48;
  iterator iStack_40;
  long *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (long *)0x0;
  local_48 = (long *)0x0;
  iStack_40._M_current = (long *)0x0;
  local_58 = (long *)0x0;
  local_68 = (long *)0x0;
  plStack_60 = (long *)0x0;
  psVar6 = SelectionResult::GetInputSet(a);
  p_Var7 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var10) {
    do {
      if (iStack_40._M_current == local_38) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_48,iStack_40,
                   (long *)(*(long *)(p_Var7 + 1) + 0x48));
      }
      else {
        *iStack_40._M_current = *(long *)(*(long *)(p_Var7 + 1) + 0x48);
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var10);
  }
  psVar6 = SelectionResult::GetInputSet(b);
  p_Var7 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  plVar2 = local_48;
  iVar9._M_current = iStack_40._M_current;
  while (local_48 = plVar2, iStack_40._M_current = iVar9._M_current,
        (_Rb_tree_header *)p_Var7 != &(psVar6->_M_t)._M_impl.super__Rb_tree_header) {
    if (plStack_60 == local_58) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&local_68,(iterator)plStack_60,
                 (long *)(*(long *)(p_Var7 + 1) + 0x48));
    }
    else {
      *plStack_60 = *(long *)(*(long *)(p_Var7 + 1) + 0x48);
      plStack_60 = plStack_60 + 1;
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    plVar2 = local_48;
    iVar9._M_current = iStack_40._M_current;
  }
  if (plVar2 != iVar9._M_current) {
    uVar8 = (long)iVar9._M_current - (long)plVar2 >> 3;
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar2,iVar9._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar2,iVar9._M_current);
  }
  plVar4 = plStack_60;
  plVar2 = local_68;
  plVar3 = local_48;
  iVar9._M_current = local_48;
  if (local_68 != plStack_60) {
    uVar8 = (long)plStack_60 - (long)local_68 >> 3;
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68,plStack_60,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar2,plVar4);
    plVar2 = local_68;
    plVar3 = local_48;
    iVar9._M_current = local_48;
  }
  for (; (iVar5._M_current = iStack_40._M_current, plVar4 = plStack_60,
         plVar3 != iStack_40._M_current && (iVar9._M_current = plVar3, *plVar3 == *plVar2));
      plVar3 = plVar3 + 1) {
    plVar2 = plVar2 + 1;
    iVar9._M_current = iStack_40._M_current;
  }
  if (local_68 != (long *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return plVar2 == plVar4 && iVar9._M_current == iVar5._M_current;
}

Assistant:

static bool EquivalentResult(const SelectionResult& a, const SelectionResult& b)
{
    std::vector<CAmount> a_amts;
    std::vector<CAmount> b_amts;
    for (const auto& coin : a.GetInputSet()) {
        a_amts.push_back(coin->txout.nValue);
    }
    for (const auto& coin : b.GetInputSet()) {
        b_amts.push_back(coin->txout.nValue);
    }
    std::sort(a_amts.begin(), a_amts.end());
    std::sort(b_amts.begin(), b_amts.end());

    std::pair<std::vector<CAmount>::iterator, std::vector<CAmount>::iterator> ret = std::mismatch(a_amts.begin(), a_amts.end(), b_amts.begin());
    return ret.first == a_amts.end() && ret.second == b_amts.end();
}